

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O0

void __thiscall
testing::internal::ScopedTrace::ScopedTrace(ScopedTrace *this,char *file,int line,Message *message)

{
  UnitTest *this_00;
  string local_78;
  undefined1 local_58 [8];
  TraceInfo trace;
  Message *message_local;
  int line_local;
  char *file_local;
  ScopedTrace *this_local;
  
  trace.message.field_2._8_8_ = message;
  TraceInfo::TraceInfo((TraceInfo *)local_58);
  local_58 = (undefined1  [8])file;
  trace.file._0_4_ = line;
  Message::GetString_abi_cxx11_(&local_78,(Message *)trace.message.field_2._8_8_);
  std::__cxx11::string::operator=((string *)&trace.line,(string *)&local_78);
  std::__cxx11::string::~string((string *)&local_78);
  this_00 = UnitTest::GetInstance();
  UnitTest::PushGTestTrace(this_00,(TraceInfo *)local_58);
  TraceInfo::~TraceInfo((TraceInfo *)local_58);
  return;
}

Assistant:

GTEST_LOCK_EXCLUDED_(&UnitTest::mutex_) {
  TraceInfo trace;
  trace.file = file;
  trace.line = line;
  trace.message = message.GetString();

  UnitTest::GetInstance()->PushGTestTrace(trace);
}